

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void VScaleDiffVectorArray_Serial(int nvec,sunrealtype c,N_Vector *X,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < nvec) {
    lVar1 = *(*X)->content;
    uVar6 = 0;
    do {
      if (0 < lVar1) {
        lVar2 = *(long *)((long)X[uVar6]->content + 0x10);
        lVar3 = *(long *)((long)Y[uVar6]->content + 0x10);
        lVar4 = *(long *)((long)Z[uVar6]->content + 0x10);
        lVar5 = 0;
        do {
          *(double *)(lVar4 + lVar5 * 8) =
               (*(double *)(lVar2 + lVar5 * 8) - *(double *)(lVar3 + lVar5 * 8)) * c;
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nvec);
  }
  return;
}

Assistant:

static void VScaleDiffVectorArray_Serial(int nvec, sunrealtype c, N_Vector* X,
                                         N_Vector* Y, N_Vector* Z)
{
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;

  N = NV_LENGTH_S(X[0]);

  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = c * (xd[j] - yd[j]); }
  }
}